

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O2

int test_typed_empty_monster(flatcc_builder_t *B)

{
  MyGame_Example_Monster_ref_t root;
  int iVar1;
  int iVar2;
  void *addr;
  char *pcVar3;
  char *__format;
  size_t size;
  char local_1c [4];
  
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  flatcc_builder_reset(B);
  flatbuffers_buffer_start(B,anon_var_dwarf_1b7);
  MyGame_Example_Monster_start(B);
  MyGame_Example_Monster_name_create_str(B,"MyMonster");
  root = MyGame_Example_Monster_end(B);
  flatcc_builder_end_buffer(B,root);
  addr = flatcc_builder_finalize_aligned_buffer(B,&size);
  hexdump("empty typed monster table",addr,size,_stderr);
  if (*(int *)((long)addr + 4) == 0x330ef481) {
    iVar1 = verify_empty_monster(addr);
    if (iVar1 != 0) {
      iVar1 = MyGame_Example_Monster_verify_as_root_with_identifier(addr,size,anon_var_dwarf_1b7);
      if (iVar1 == 0) {
        iVar1 = flatcc_verify_table_as_root
                          (addr,size,anon_var_dwarf_1b7,MyGame_Example_Monster_verify_table);
        if (iVar1 != 0) goto LAB_00104d1f;
        iVar1 = MyGame_Example_Monster_verify_as_root_with_type_hash(addr,size,0x330ef481);
        if (iVar1 == 0) {
          iVar1 = MyGame_Example_Monster_verify_as_root_with_type_hash(addr,size,0x330ef481);
          if (iVar1 == 0) {
            local_1c[0] = -0x7f;
            local_1c[1] = -0xc;
            local_1c[2] = '\x0e';
            local_1c[3] = '3';
            iVar1 = MyGame_Example_Monster_verify_as_root_with_identifier(addr,size,local_1c);
            if (iVar1 == 0) {
              iVar2 = MyGame_Example_Monster_verify_as_root(addr,size);
              iVar1 = 0;
              if (iVar2 == 0) {
                puts("should not have verified with the original identifier since we use types");
              }
              goto LAB_00104d5a;
            }
            goto LAB_00104d1f;
          }
          pcVar3 = flatcc_verify_error_string(iVar1);
          __format = "could not verify empty monster with explicit type hash, got %s\n";
        }
        else {
          pcVar3 = flatcc_verify_error_string(iVar1);
          __format = "could not verify empty monster with type hash, got %s\n";
        }
      }
      else {
LAB_00104d1f:
        pcVar3 = flatcc_verify_error_string(iVar1);
        __format = "could not verify typed empty monster, got %s\n";
      }
      printf(__format,pcVar3);
      goto LAB_00104d5a;
    }
    puts("typed empty monster should not verify with default identifier");
  }
  else {
    printf("Monster does not have the expected type, got %lx\n");
  }
  iVar1 = -1;
LAB_00104d5a:
  flatcc_builder_aligned_free(addr);
  return iVar1;
}

Assistant:

int test_typed_empty_monster(flatcc_builder_t *B)
{
    int ret = -1;
    ns(Monster_ref_t) root;
    void *buffer;
    size_t size;
    flatbuffers_fid_t fid = { 0 };

    flatcc_builder_reset(B);

    flatbuffers_buffer_start(B, ns(Monster_type_identifier));
    ns(Monster_start(B));
    /* Cannot make monster empty as name is required. */
    ns(Monster_name_create_str(B, "MyMonster"));
    root = ns(Monster_end(B));
    flatbuffers_buffer_end(B, root);


    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);

    hexdump("empty typed monster table", buffer, size, stderr);

    if (flatbuffers_get_type_hash(buffer) != flatbuffers_type_hash_from_name("MyGame.Example.Monster")) {

        printf("Monster does not have the expected type, got %lx\n", (unsigned long)flatbuffers_get_type_hash(buffer));
        goto done;
    }

    if (!flatbuffers_has_type_hash(buffer, ns(Monster_type_hash))) {
        printf("Monster does not have the expected type\n");
        goto done;
    }
    if (!flatbuffers_has_type_hash(buffer, 0x330ef481)) {
        printf("Monster does not have the expected type\n");
        goto done;
    }

    if (!verify_empty_monster(buffer)) {
        printf("typed empty monster should not verify with default identifier\n");
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, ns(Monster_type_identifier))))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_typed_root(buffer, size)))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_type_hash(buffer, size, ns(Monster_type_hash))))) {
        printf("could not verify empty monster with type hash, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_type_hash(buffer, size, flatbuffers_type_hash_from_name("MyGame.Example.Monster"))))) {
        printf("could not verify empty monster with explicit type hash, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    flatbuffers_identifier_from_type_hash(0x330ef481, fid);
    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, fid)))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if (!ns(Monster_verify_as_root(buffer, size))) {
        printf("should not have verified with the original identifier since we use types\n");
        goto done;
    }
    ret = 0;

done:
    flatcc_builder_aligned_free(buffer);
    return ret;
}